

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symArrays.cpp
# Opt level: O3

bool StrCmp(char *string1,char *string2)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    cVar2 = string1[lVar3];
    pcVar1 = string2 + lVar3;
    if (cVar2 == '\0') break;
    lVar3 = lVar3 + 1;
  } while (cVar2 == *pcVar1);
  return cVar2 == *pcVar1;
}

Assistant:

bool StrCmp(char string1[], char string2[])
{
    int i = 0;

    //Infinite loop is ok because we have exit conditions.
    while(true)
    {
        if(string1[i] == string2[i])
        {
            if(string1[i] == '\0')
            {
                return true;
            }
            else
            {
                i++;
            }

        }
        else
        {
            return false;
        }
    }
}